

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::FieldDefinition_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  char *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  char *pcVar3;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  string value_type;
  string name;
  string key_type;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  string local_70;
  string local_50;
  
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)options);
  if (bVar1) {
    options_00 = (GeneratorOptions *)anon_unknown_0::MapFieldKey((FieldDescriptor *)options);
    options_01 = (GeneratorOptions *)anon_unknown_0::MapFieldValue((FieldDescriptor *)options);
    ProtoTypeName_abi_cxx11_(&local_70,this,options_00,field);
    local_a8 = (char *)0x0;
    local_a0 = 0;
    local_b0 = &local_a0;
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options_01);
    pFVar4 = extraout_RDX;
    if ((TVar2 == TYPE_ENUM) ||
       (TVar2 = FieldDescriptor::type((FieldDescriptor *)options_01), pFVar4 = extraout_RDX_00,
       TVar2 == TYPE_MESSAGE)) {
      RelativeTypeName_abi_cxx11_(&local_90,(_anonymous_namespace_ *)options_01,pFVar4);
    }
    else {
      ProtoTypeName_abi_cxx11_(&local_90,this,options_01,field);
    }
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"map<%s, %s> %s = %d;",local_70._M_dataplus._M_p,local_b0,
               *(undefined8 *)(options->output_dir)._M_dataplus._M_p,
               (ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8));
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00226834;
  }
  field_00 = "optional";
  pcVar3 = "required";
  if (*(int *)&options->field_0x4c == 1) {
    pcVar3 = "optional";
  }
  pcVar5 = "repeated";
  if (*(int *)&options->field_0x4c != 3) {
    pcVar5 = pcVar3;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar5,pcVar5 + 8);
  local_a8 = (char *)0x0;
  local_a0 = 0;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0 = &local_a0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
  pFVar4 = extraout_RDX_01;
  if ((TVar2 == TYPE_ENUM) ||
     (TVar2 = FieldDescriptor::type((FieldDescriptor *)options), pFVar4 = extraout_RDX_02,
     TVar2 == TYPE_MESSAGE)) {
    RelativeTypeName_abi_cxx11_(&local_50,(_anonymous_namespace_ *)options,pFVar4);
LAB_0022670d:
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)options);
    if (TVar2 != TYPE_GROUP) {
      ProtoTypeName_abi_cxx11_(&local_50,this,options,(FieldDescriptor *)field_00);
      goto LAB_0022670d;
    }
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,local_a8,0x359e05);
    FieldDescriptor::message_type((FieldDescriptor *)options);
  }
  std::__cxx11::string::_M_assign((string *)&local_90);
  StringPrintf_abi_cxx11_
            (__return_storage_ptr__,"%s %s %s = %d;",local_70._M_dataplus._M_p,local_b0,
             local_90._M_dataplus._M_p,
             (ulong)*(uint *)((long)&(options->namespace_prefix).field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return __return_storage_ptr__;
  }
LAB_00226834:
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

string FieldDefinition(const GeneratorOptions& options,
                       const FieldDescriptor* field) {
  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    string key_type = ProtoTypeName(options, key_field);
    string value_type;
    if (value_field->type() == FieldDescriptor::TYPE_ENUM ||
        value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      value_type = RelativeTypeName(value_field);
    } else {
      value_type = ProtoTypeName(options, value_field);
    }
    return StringPrintf("map<%s, %s> %s = %d;",
                        key_type.c_str(),
                        value_type.c_str(),
                        field->name().c_str(),
                        field->number());
  } else {
    string qualifier = field->is_repeated() ? "repeated" :
        (field->is_optional() ? "optional" : "required");
    string type, name;
    if (field->type() == FieldDescriptor::TYPE_ENUM ||
        field->type() == FieldDescriptor::TYPE_MESSAGE) {
      type = RelativeTypeName(field);
      name = field->name();
    } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
      type = "group";
      name = field->message_type()->name();
    } else {
      type = ProtoTypeName(options, field);
      name = field->name();
    }
    return StringPrintf("%s %s %s = %d;",
                        qualifier.c_str(),
                        type.c_str(),
                        name.c_str(),
                        field->number());
  }
}